

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O1

void __thiscall Assimp::Blender::FileDatabase::FileDatabase(FileDatabase *this)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->dna).converters._M_t._M_impl.super__Rb_tree_header;
  (this->dna).converters._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dna).converters._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->dna).converters._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->dna).converters._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->dna).indices._M_t._M_impl.super__Rb_tree_header;
  (this->dna).indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dna).indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->dna).converters._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->dna).structures.
  super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dna).structures.
  super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dna).structures.
  super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dna).indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->dna).indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->dna).indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->reader).super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->reader).super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->entries).
  super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>.
  super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->entries).
  super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>.
  super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->entries).
  super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>.
  super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_stats).fields_read = 0;
  (this->_stats).pointers_resolved = 0;
  (this->_stats).cache_hits = 0;
  (this->_stats).cached_objects = 0;
  ObjectCache<std::shared_ptr>::ObjectCache(&this->_cache,this);
  this->next_cache_idx = 0;
  return;
}

Assistant:

FileDatabase()
        : _cacheArrays(*this)
        , _cache(*this)
        , next_cache_idx()
    {}